

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.h
# Opt level: O0

SingleKdTreeIndex * __thiscall
CoreML::Specification::NearestNeighborsIndex::mutable_singlekdtreeindex(NearestNeighborsIndex *this)

{
  bool bVar1;
  SingleKdTreeIndex *this_00;
  NearestNeighborsIndex *this_local;
  
  bVar1 = has_singlekdtreeindex(this);
  if (!bVar1) {
    clear_IndexType(this);
    set_has_singlekdtreeindex(this);
    this_00 = (SingleKdTreeIndex *)operator_new(0x18);
    SingleKdTreeIndex::SingleKdTreeIndex(this_00);
    (this->IndexType_).singlekdtreeindex_ = this_00;
  }
  return (SingleKdTreeIndex *)(this->IndexType_).linearindex_;
}

Assistant:

inline ::CoreML::Specification::SingleKdTreeIndex* NearestNeighborsIndex::mutable_singlekdtreeindex() {
  if (!has_singlekdtreeindex()) {
    clear_IndexType();
    set_has_singlekdtreeindex();
    IndexType_.singlekdtreeindex_ = new ::CoreML::Specification::SingleKdTreeIndex;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NearestNeighborsIndex.singleKdTreeIndex)
  return IndexType_.singlekdtreeindex_;
}